

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar3 = farmhash64_te(s,len);
  uVar6 = 0x38;
  uVar8 = 0x38;
  uVar7 = 0;
  uVar5 = uVar3 * -0x4b6d499041670d8d;
  uVar4 = uVar5;
  do {
    uVar9 = 0xffL << (uVar8 & 0x3f);
    uVar10 = 0xffL << (uVar7 & 0x3f);
    uVar8 = uVar8 - 8;
    uVar7 = uVar7 + 8;
    uVar1 = uVar6 & 0x3f;
    uVar2 = uVar6 & 0x3f;
    uVar6 = uVar6 - 0x10;
    uVar4 = ~(uVar9 | uVar10) & uVar4 | (uVar9 & uVar5) >> uVar2 | (uVar10 & uVar5) << uVar1;
  } while (uVar8 != 0x18);
  return ~uVar4;
}

Assistant:

uint64_t farmhash64(const char* s, size_t len) {
  return debug_tweak64(
#if CAN_USE_SSE41 && CAN_USE_SSE42 && x86_64
      farmhash64_te(s, len)
#else
      farmhash64_xo(s, len)
#endif
  );
}